

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O1

int __thiscall ADPlanner::ReconstructPath(ADPlanner *this,ADSearchStateSpace_t *pSearchStateSpace)

{
  uint uVar1;
  CMDPSTATE *pCVar2;
  CMDPSTATE *pCVar3;
  void *pvVar4;
  int iVar5;
  SBPL_Exception *this_00;
  CMDPSTATE *pCVar6;
  uint uVar7;
  bool bVar8;
  
  if (this->bforwardsearch == true) {
    pCVar2 = pSearchStateSpace->searchstartstate;
    iVar5 = 0;
    uVar7 = 0;
    pCVar6 = pSearchStateSpace->searchgoalstate;
    while ((bVar8 = pCVar6 != pCVar2, bVar8 && (uVar7 < 100000))) {
      uVar1 = *(uint *)((long)pCVar6->PlannerSpecificData + 0x24);
      if (uVar1 == 1000000000) {
        bVar8 = true;
        iVar5 = -1;
        break;
      }
      pCVar3 = *(CMDPSTATE **)((long)pCVar6->PlannerSpecificData + 0x30);
      if (pCVar3 == (CMDPSTATE *)0x0) {
        this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(this_00,"ERROR in ReconstructPath: bestpred is NULL");
        goto LAB_001354d1;
      }
      pvVar4 = pCVar3->PlannerSpecificData;
      *(CMDPSTATE **)((long)pvVar4 + 0x38) = pCVar6;
      uVar7 = uVar7 + 1;
      pCVar6 = pCVar3;
      if (uVar1 <= *(uint *)((long)pvVar4 + 0x20)) {
        this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception
                  (this_00,"ERROR in ReconstructPath: g-values are non-decreasing");
LAB_001354d1:
        __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    if (bVar8) {
      return iVar5;
    }
  }
  return 1;
}

Assistant:

int ADPlanner::ReconstructPath(ADSearchStateSpace_t* pSearchStateSpace)
{
    //nothing to do, if search is backward
    if (bforwardsearch) {
        CMDPSTATE* MDPstate = pSearchStateSpace->searchgoalstate;
        CMDPSTATE* PredMDPstate;
        ADState *predstateinfo, *stateinfo;

        int steps = 0;
        const int max_steps = 100000;
        while (MDPstate != pSearchStateSpace->searchstartstate && steps < max_steps) {
            steps++;

            stateinfo = (ADState*)MDPstate->PlannerSpecificData;

            if (stateinfo->g == INFINITECOST) {
                //throw SBPL_Exception("ERROR in ReconstructPath: g of the state on the path is INFINITE");
                return -1;
            }

            if (stateinfo->bestpredstate == NULL) {
                throw SBPL_Exception("ERROR in ReconstructPath: bestpred is NULL");
            }

            //get the parent state
            PredMDPstate = stateinfo->bestpredstate;
            predstateinfo = (ADState*)PredMDPstate->PlannerSpecificData;

            //set its best next info
            predstateinfo->bestnextstate = MDPstate;

            //check the decrease of g-values along the path
            if (predstateinfo->v >= stateinfo->g) {
                throw SBPL_Exception("ERROR in ReconstructPath: g-values are non-decreasing");
            }

            //transition back
            MDPstate = PredMDPstate;
        }

        if (MDPstate != pSearchStateSpace->searchstartstate) {
            SBPL_ERROR("ERROR: Failed to reconstruct path (compute bestnextstate pointers): steps processed=%d\n",
                       steps);
            return 0;
        }
    }

    return 1;
}